

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O3

void __thiscall GlobOpt::GenerateLoopCount(GlobOpt *this,Loop *loop,LoopCount *loopCount)

{
  BailOutInfo *bailOutInfo;
  Instr *instr;
  Func *func;
  Func *pFVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  undefined4 *puVar7;
  StackSym *pSVar8;
  BailOutInstrTemplate<IR::Instr> *pBVar9;
  RegOpnd *pRVar10;
  Opnd *this_00;
  StackSym *pSVar11;
  Instr *this_01;
  IntConstOpnd *this_02;
  IntConstOpnd *local_40;
  
  bVar4 = DoLoopCountBasedBoundCheckHoist(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x693,"(DoLoopCountBasedBoundCheckHoist())",
                       "DoLoopCountBasedBoundCheckHoist()");
    if (!bVar4) goto LAB_004a71a6;
    *puVar7 = 0;
  }
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x694,"(loop)","loop");
    if (!bVar4) goto LAB_004a71a6;
    *puVar7 = 0;
  }
  if (loopCount == (LoopCount *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x695,"(loopCount)","loopCount");
    if (!bVar4) goto LAB_004a71a6;
    *puVar7 = 0;
  }
  if (loop->loopCount != loopCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x696,"(loopCount == loop->loopCount)","loopCount == loop->loopCount");
    if (!bVar4) goto LAB_004a71a6;
    *puVar7 = 0;
  }
  if (loopCount->hasBeenGenerated == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x697,"(!loopCount->HasBeenGenerated())","!loopCount->HasBeenGenerated()");
    if (!bVar4) goto LAB_004a71a6;
    *puVar7 = 0;
  }
  bailOutInfo = loop->bailOutInfo;
  if (bailOutInfo == (BailOutInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x69d,"(bailOutInfo)","bailOutInfo");
    if (!bVar4) goto LAB_004a71a6;
    *puVar7 = 0;
  }
  instr = bailOutInfo->bailOutInstr;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x6a0,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar4) goto LAB_004a71a6;
    *puVar7 = 0;
  }
  func = bailOutInfo->bailOutFunc;
  iVar6 = LoopCount::Offset(loopCount);
  if (iVar6 == 0) {
    local_40 = (IntConstOpnd *)0x0;
  }
  else {
    iVar6 = LoopCount::Offset(loopCount);
    local_40 = IR::IntConstOpnd::New((long)iVar6,TyInt32,func,true);
  }
  pSVar8 = LoopCount::RightSym(loopCount);
  if (pSVar8 == (StackSym *)0x0) {
    pSVar8 = LoopCount::LeftSym(loopCount);
    if (pSVar8 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x6cd,"(loopCount->LeftSym())","loopCount->LeftSym()");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    pSVar8 = LoopCount::LeftSym(loopCount);
  }
  else {
    pBVar9 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (Sub_I4,BailOutOnFailedHoistedLoopCountBasedBoundCheck,bailOutInfo,func);
    pRVar10 = IR::RegOpnd::New(pSVar8,pSVar8->m_type,func);
    if ((pBVar9->super_Instr).m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    pFVar1 = (pBVar9->super_Instr).m_func;
    if ((pRVar10->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    bVar5 = (pRVar10->super_Opnd).field_0xb;
    if ((bVar5 & 2) != 0) {
      pRVar10 = (RegOpnd *)IR::Opnd::Copy(&pRVar10->super_Opnd,pFVar1);
      bVar5 = (pRVar10->super_Opnd).field_0xb;
    }
    (pRVar10->super_Opnd).field_0xb = bVar5 | 2;
    (pBVar9->super_Instr).m_src2 = &pRVar10->super_Opnd;
    IR::Opnd::SetIsJITOptimizedReg(&pRVar10->super_Opnd,true);
    pSVar8 = LoopCount::LeftSym(loopCount);
    if (pSVar8 == (StackSym *)0x0) {
      if (local_40 == (IntConstOpnd *)0x0) {
        (pBVar9->super_Instr).m_opcode = Neg_I4;
        this_00 = IR::Instr::UnlinkSrc2(&pBVar9->super_Instr);
        if ((pBVar9->super_Instr).m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar4) goto LAB_004a71a6;
          *puVar7 = 0;
        }
        pFVar1 = (pBVar9->super_Instr).m_func;
        if (this_00->isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar4) goto LAB_004a71a6;
          *puVar7 = 0;
        }
        bVar5 = this_00->field_0xb;
        if ((bVar5 & 2) != 0) {
          this_00 = IR::Opnd::Copy(this_00,pFVar1);
          bVar5 = this_00->field_0xb;
        }
        this_00->field_0xb = bVar5 | 2;
        (pBVar9->super_Instr).m_src1 = this_00;
        local_40 = (IntConstOpnd *)0x0;
      }
      else {
        if ((pBVar9->super_Instr).m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar4) goto LAB_004a71a6;
          *puVar7 = 0;
        }
        pFVar1 = (pBVar9->super_Instr).m_func;
        if ((local_40->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar4) goto LAB_004a71a6;
          *puVar7 = 0;
        }
        bVar5 = (local_40->super_Opnd).field_0xb;
        if ((bVar5 & 2) != 0) {
          local_40 = (IntConstOpnd *)IR::Opnd::Copy(&local_40->super_Opnd,pFVar1);
          bVar5 = (local_40->super_Opnd).field_0xb;
        }
        (local_40->super_Opnd).field_0xb = bVar5 | 2;
        (pBVar9->super_Instr).m_src1 = &local_40->super_Opnd;
        local_40 = (IntConstOpnd *)0x0;
      }
    }
    else {
      pRVar10 = IR::RegOpnd::New(pSVar8,pSVar8->m_type,func);
      if ((pBVar9->super_Instr).m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar4) goto LAB_004a71a6;
        *puVar7 = 0;
      }
      pFVar1 = (pBVar9->super_Instr).m_func;
      if ((pRVar10->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar4) goto LAB_004a71a6;
        *puVar7 = 0;
      }
      bVar5 = (pRVar10->super_Opnd).field_0xb;
      if ((bVar5 & 2) != 0) {
        pRVar10 = (RegOpnd *)IR::Opnd::Copy(&pRVar10->super_Opnd,pFVar1);
        bVar5 = (pRVar10->super_Opnd).field_0xb;
      }
      (pRVar10->super_Opnd).field_0xb = bVar5 | 2;
      (pBVar9->super_Instr).m_src1 = &pRVar10->super_Opnd;
      IR::Opnd::SetIsJITOptimizedReg(&pRVar10->super_Opnd,true);
    }
    pSVar8 = StackSym::New(TyInt32,func);
    pRVar10 = IR::RegOpnd::New(pSVar8,pSVar8->m_type,func);
    IR::Instr::SetDst(&pBVar9->super_Instr,&pRVar10->super_Opnd);
    IR::Opnd::SetIsJITOptimizedReg((pBVar9->super_Instr).m_dst,true);
    IR::Instr::SetByteCodeOffset(&pBVar9->super_Instr,instr);
    IR::Instr::InsertBefore(instr,&pBVar9->super_Instr);
  }
  if (local_40 != (IntConstOpnd *)0x0) {
    pBVar9 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (Add_I4,BailOutOnFailedHoistedLoopCountBasedBoundCheck,bailOutInfo,func);
    pRVar10 = IR::RegOpnd::New(pSVar8,pSVar8->m_type,func);
    if ((pBVar9->super_Instr).m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    pFVar1 = (pBVar9->super_Instr).m_func;
    if ((pRVar10->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    bVar5 = (pRVar10->super_Opnd).field_0xb;
    if ((bVar5 & 2) != 0) {
      pRVar10 = (RegOpnd *)IR::Opnd::Copy(&pRVar10->super_Opnd,pFVar1);
      bVar5 = (pRVar10->super_Opnd).field_0xb;
    }
    (pRVar10->super_Opnd).field_0xb = bVar5 | 2;
    (pBVar9->super_Instr).m_src1 = &pRVar10->super_Opnd;
    IR::Opnd::SetIsJITOptimizedReg(&pRVar10->super_Opnd,true);
    lVar2 = (local_40->super_EncodableOpnd<long>).m_value;
    if (lVar2 != -0x80000000 && lVar2 < 0) {
      (pBVar9->super_Instr).m_opcode = Sub_I4;
      IR::IntConstOpnd::SetValue(local_40,-lVar2);
    }
    if ((pBVar9->super_Instr).m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    pFVar1 = (pBVar9->super_Instr).m_func;
    if ((local_40->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    bVar5 = (local_40->super_Opnd).field_0xb;
    if ((bVar5 & 2) != 0) {
      local_40 = (IntConstOpnd *)IR::Opnd::Copy(&local_40->super_Opnd,pFVar1);
      bVar5 = (local_40->super_Opnd).field_0xb;
    }
    (local_40->super_Opnd).field_0xb = bVar5 | 2;
    (pBVar9->super_Instr).m_src2 = &local_40->super_Opnd;
    pSVar11 = LoopCount::LeftSym(loopCount);
    if (pSVar8 == pSVar11) {
      pSVar8 = StackSym::New(TyInt32,func);
    }
    pRVar10 = IR::RegOpnd::New(pSVar8,pSVar8->m_type,func);
    IR::Instr::SetDst(&pBVar9->super_Instr,&pRVar10->super_Opnd);
    IR::Opnd::SetIsJITOptimizedReg((pBVar9->super_Instr).m_dst,true);
    IR::Instr::SetByteCodeOffset(&pBVar9->super_Instr,instr);
    IR::Instr::InsertBefore(instr,&pBVar9->super_Instr);
  }
  iVar6 = LoopCount::MinMagnitudeChange(loopCount);
  if (iVar6 == 1) {
    pSVar11 = LoopCount::LeftSym(loopCount);
    if (pSVar8 == pSVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x703,"(intermediateValueSym != loopCount->LeftSym())",
                         "intermediateValueSym != loopCount->LeftSym()");
      if (!bVar4) {
LAB_004a71a6:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
  }
  else {
    this_01 = IR::Instr::New(Div_I4,func);
    pRVar10 = IR::RegOpnd::New(pSVar8,pSVar8->m_type,func);
    if (this_01->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    pFVar1 = this_01->m_func;
    if ((pRVar10->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    bVar5 = (pRVar10->super_Opnd).field_0xb;
    if ((bVar5 & 2) != 0) {
      pRVar10 = (RegOpnd *)IR::Opnd::Copy(&pRVar10->super_Opnd,pFVar1);
      bVar5 = (pRVar10->super_Opnd).field_0xb;
    }
    (pRVar10->super_Opnd).field_0xb = bVar5 | 2;
    this_01->m_src1 = &pRVar10->super_Opnd;
    IR::Opnd::SetIsJITOptimizedReg(&pRVar10->super_Opnd,true);
    if (iVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x6f4,"(minMagnitudeChange != 0)","minMagnitudeChange != 0");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    this_02 = IR::IntConstOpnd::New((long)iVar6,TyInt32,func,true);
    if (this_01->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    pFVar1 = this_01->m_func;
    if ((this_02->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_004a71a6;
      *puVar7 = 0;
    }
    bVar5 = (this_02->super_Opnd).field_0xb;
    if ((bVar5 & 2) != 0) {
      this_02 = (IntConstOpnd *)IR::Opnd::Copy(&this_02->super_Opnd,pFVar1);
      bVar5 = (this_02->super_Opnd).field_0xb;
    }
    (this_02->super_Opnd).field_0xb = bVar5 | 2;
    this_01->m_src2 = &this_02->super_Opnd;
    pSVar11 = LoopCount::LeftSym(loopCount);
    if (pSVar8 == pSVar11) {
      pSVar8 = StackSym::New(TyInt32,func);
    }
    pRVar10 = IR::RegOpnd::New(pSVar8,pSVar8->m_type,func);
    IR::Instr::SetDst(this_01,&pRVar10->super_Opnd);
    IR::Opnd::SetIsJITOptimizedReg(this_01->m_dst,true);
    IR::Instr::SetByteCodeOffset(this_01,instr);
    IR::Instr::InsertBefore(instr,this_01);
  }
  LoopCount::SetLoopCountMinusOneSym(loopCount,pSVar8);
  return;
}

Assistant:

void GlobOpt::GenerateLoopCount(Loop *const loop, LoopCount *const loopCount)
{
    Assert(DoLoopCountBasedBoundCheckHoist());
    Assert(loop);
    Assert(loopCount);
    Assert(loopCount == loop->loopCount);
    Assert(!loopCount->HasBeenGenerated());

    // loopCountMinusOne = (left - right + offset) / minMagnitudeChange

    // Prepare the landing pad for bailouts and instruction insertion
    BailOutInfo *const bailOutInfo = loop->bailOutInfo;
    Assert(bailOutInfo);
    const IR::BailOutKind bailOutKind = IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck;
    IR::Instr *const insertBeforeInstr = bailOutInfo->bailOutInstr;
    Assert(insertBeforeInstr);
    Func *const func = bailOutInfo->bailOutFunc;

    // intermediateValue = left - right
    IR::IntConstOpnd *offset =
        loopCount->Offset() == 0 ? nullptr : IR::IntConstOpnd::New(loopCount->Offset(), TyInt32, func, true);
    StackSym *const rightSym = loopCount->RightSym();
    StackSym *intermediateValueSym;
    if(rightSym)
    {
        IR::BailOutInstr *const instr = IR::BailOutInstr::New(Js::OpCode::Sub_I4, bailOutKind, bailOutInfo, func);

        instr->SetSrc2(IR::RegOpnd::New(rightSym, rightSym->GetType(), func));
        instr->GetSrc2()->SetIsJITOptimizedReg(true);

        StackSym *const leftSym = loopCount->LeftSym();
        if(leftSym)
        {
            // intermediateValue = left - right
            instr->SetSrc1(IR::RegOpnd::New(leftSym, leftSym->GetType(), func));
            instr->GetSrc1()->SetIsJITOptimizedReg(true);
        }
        else if(offset)
        {
            // intermediateValue = offset - right
            instr->SetSrc1(offset);
            offset = nullptr;
        }
        else
        {
            // intermediateValue = -right
            instr->m_opcode = Js::OpCode::Neg_I4;
            instr->SetSrc1(instr->UnlinkSrc2());
        }

        intermediateValueSym = StackSym::New(TyInt32, func);
        instr->SetDst(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }
    else
    {
        // intermediateValue = left
        Assert(loopCount->LeftSym());
        intermediateValueSym = loopCount->LeftSym();
    }

    // intermediateValue += offset
    if(offset)
    {
        IR::BailOutInstr *const instr = IR::BailOutInstr::New(Js::OpCode::Add_I4, bailOutKind, bailOutInfo, func);

        instr->SetSrc1(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetSrc1()->SetIsJITOptimizedReg(true);

        if(offset->GetValue() < 0 && offset->GetValue() != IntConstMin)
        {
            instr->m_opcode = Js::OpCode::Sub_I4;
            offset->SetValue(-offset->GetValue());
        }
        instr->SetSrc2(offset);

        if(intermediateValueSym == loopCount->LeftSym())
        {
            intermediateValueSym = StackSym::New(TyInt32, func);
        }
        instr->SetDst(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }

    // intermediateValue /= minMagnitudeChange
    const int minMagnitudeChange = loopCount->MinMagnitudeChange();
    if(minMagnitudeChange != 1)
    {
        IR::Instr *const instr = IR::Instr::New(Js::OpCode::Div_I4, func);

        instr->SetSrc1(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetSrc1()->SetIsJITOptimizedReg(true);

        Assert(minMagnitudeChange != 0); // bailout is not needed
        instr->SetSrc2(IR::IntConstOpnd::New(minMagnitudeChange, TyInt32, func, true));

        if(intermediateValueSym == loopCount->LeftSym())
        {
            intermediateValueSym = StackSym::New(TyInt32, func);
        }
        instr->SetDst(IR::RegOpnd::New(intermediateValueSym, intermediateValueSym->GetType(), func));
        instr->GetDst()->SetIsJITOptimizedReg(true);

        instr->SetByteCodeOffset(insertBeforeInstr);
        insertBeforeInstr->InsertBefore(instr);
    }
    else
    {
        Assert(intermediateValueSym != loopCount->LeftSym());
    }

    // loopCountMinusOne = intermediateValue
    loopCount->SetLoopCountMinusOneSym(intermediateValueSym);
}